

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

void hash_check_collision(adh_weight_t weight,int hash_index,adh_node_t *node)

{
  hash_entry_t *local_28;
  hash_entry_t *he;
  int size;
  adh_node_t *node_local;
  int hash_index_local;
  adh_weight_t weight_local;
  
  if (node->weight != weight) {
    he._4_4_ = 0;
    for (local_28 = map_weight_nodes.buckets[hash_index]; local_28 != (hash_entry_t *)0x0;
        local_28 = local_28->next) {
      he._4_4_ = he._4_4_ + 1;
    }
    log_info("hash_check_collision","collision, size:%d w1:%d w2:%d\n",(ulong)he._4_4_,(ulong)weight
             ,(ulong)node->weight);
  }
  return;
}

Assistant:

void hash_check_collision(adh_weight_t weight, int hash_index, const adh_node_t *node) {
    if(node->weight != weight) {
        int size = 0;
        hash_entry_t* he = map_weight_nodes.buckets[hash_index];
        while(he != NULL) {
            size++;
            he = he->next;
        }
        log_info("hash_check_collision", "collision, size:%d w1:%d w2:%d\n", size, weight, node->weight);
    }
}